

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O1

int Abc_NodeResubMffc(Abc_ManRst_t *p,Vec_Ptr_t *vDecs,int nLeaves,Abc_Obj_t *pRoot)

{
  undefined4 uVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  void **ppvVar8;
  ulong uVar9;
  uint uVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  Vec_Ptr_t *pVVar14;
  ulong uVar15;
  
  uVar9 = (ulong)(uint)nLeaves;
  pAVar3 = pRoot->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar6 = pAVar3->vObjs->nSize;
    uVar15 = (long)iVar6 + 500;
    iVar5 = (int)uVar15;
    if ((pAVar3->vTravIds).nCap < iVar5) {
      piVar7 = (int *)malloc(uVar15 * 4);
      (pAVar3->vTravIds).pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar5;
      uVar9 = extraout_RDX;
    }
    if (-500 < iVar6) {
      memset((pAVar3->vTravIds).pArray,0,(uVar15 & 0xffffffff) << 2);
      uVar9 = extraout_RDX_00;
    }
    (pAVar3->vTravIds).nSize = iVar5;
  }
  iVar5 = (int)uVar9;
  iVar6 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar6 + 1;
  if (0x3ffffffe < iVar6) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  uVar15 = (ulong)(uint)nLeaves;
  if (0 < nLeaves) {
    uVar13 = 0;
    do {
      if ((long)vDecs->nSize <= (long)uVar13) goto LAB_00295f8b;
      lVar12 = *vDecs->pArray[uVar13];
      uVar1 = *(undefined4 *)(lVar12 + 0xd8);
      iVar6 = (int)*(long *)((long)vDecs->pArray[uVar13] + 0x10);
      Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar6 + 1,(int)uVar9);
      iVar5 = (int)extraout_RDX_01;
      if (((long)iVar6 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar12 + 0xe8) + (long)iVar6 * 4) = uVar1;
      uVar13 = uVar13 + 1;
      uVar9 = extraout_RDX_01;
    } while (uVar15 != uVar13);
  }
  pAVar3 = pRoot->pNtk;
  iVar6 = pRoot->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,iVar5);
  if ((-1 < (long)iVar6) && (iVar6 < (pAVar3->vTravIds).nSize)) {
    if ((pAVar3->vTravIds).pArray[iVar6] != pRoot->pNtk->nTravIds + -1) {
      __assert_fail("Abc_NodeIsTravIdPrevious(pRoot)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                    ,0x497,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)");
    }
    iVar5 = Abc_NodeResubMffc_rec(pRoot);
    p->vTemp->nSize = 0;
    iVar6 = vDecs->nSize;
    uVar10 = 0;
    if (iVar6 <= nLeaves) {
LAB_00295ed3:
      pVVar14 = p->vTemp;
      if (0 < pVVar14->nSize) {
        lVar12 = 0;
        do {
          if (((int)uVar10 < 0) || (iVar6 <= (int)(uVar10 + (int)lVar12))) {
LAB_00295faa:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          vDecs->pArray[(ulong)uVar10 + lVar12] = pVVar14->pArray[lVar12];
          lVar12 = lVar12 + 1;
          pVVar14 = p->vTemp;
        } while (lVar12 < pVVar14->nSize);
        uVar10 = uVar10 + (int)lVar12;
      }
      uVar2 = p->vDecs->nSize;
      if (uVar10 != uVar2) {
        __assert_fail("k == Vec_PtrSize(p->vDecs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                      ,0x4a4,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)")
        ;
      }
      if (0 < (int)uVar2) {
        if ((Abc_Obj_t *)p->vDecs->pArray[(ulong)uVar2 - 1] == pRoot) {
          return iVar5;
        }
        __assert_fail("pRoot == Vec_PtrEntryLast(p->vDecs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                      ,0x4a5,"int Abc_NodeResubMffc(Abc_ManRst_t *, Vec_Ptr_t *, int, Abc_Obj_t *)")
        ;
      }
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
    }
    uVar10 = 0;
    uVar11 = extraout_RDX_02;
    do {
      if (nLeaves < 0) {
LAB_00295f8b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar4 = (long *)vDecs->pArray[uVar15];
      lVar12 = *plVar4;
      iVar6 = (int)plVar4[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar12 + 0xe0),iVar6 + 1,(int)uVar11);
      if (((long)iVar6 < 0) || (*(int *)(lVar12 + 0xe4) <= iVar6)) break;
      uVar11 = extraout_RDX_03;
      if (*(int *)(*(long *)(lVar12 + 0xe8) + (long)iVar6 * 4) == *(int *)(*plVar4 + 0xd8)) {
        pVVar14 = p->vTemp;
        uVar2 = pVVar14->nCap;
        if (pVVar14->nSize == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar14->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
              uVar11 = extraout_RDX_06;
            }
            else {
              ppvVar8 = (void **)realloc(pVVar14->pArray,0x80);
              uVar11 = extraout_RDX_04;
            }
            pVVar14->pArray = ppvVar8;
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar2 * 2;
            if (iVar6 <= (int)uVar2) goto LAB_00295eae;
            if (pVVar14->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
              uVar11 = extraout_RDX_07;
            }
            else {
              ppvVar8 = (void **)realloc(pVVar14->pArray,(ulong)uVar2 << 4);
              uVar11 = extraout_RDX_05;
            }
            pVVar14->pArray = ppvVar8;
          }
          pVVar14->nCap = iVar6;
        }
LAB_00295eae:
        iVar6 = pVVar14->nSize;
        pVVar14->nSize = iVar6 + 1;
        ppvVar8 = pVVar14->pArray + iVar6;
      }
      else {
        if (((int)uVar10 < 0) || (vDecs->nSize <= (int)uVar10)) goto LAB_00295faa;
        uVar9 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
        ppvVar8 = vDecs->pArray + uVar9;
      }
      *ppvVar8 = plVar4;
      uVar15 = uVar15 + 1;
      iVar6 = vDecs->nSize;
      if (iVar6 <= (int)uVar15) goto LAB_00295ed3;
    } while( true );
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_NodeResubMffc( Abc_ManRst_t * p, Vec_Ptr_t * vDecs, int nLeaves, Abc_Obj_t * pRoot )
{
    Abc_Obj_t * pObj;
    int Counter, i, k;
    // increment the traversal ID for the leaves
    Abc_NtkIncrementTravId( pRoot->pNtk );
    // label the leaves
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vDecs, pObj, i, nLeaves )
        Abc_NodeSetTravIdCurrent( pObj ); 
    // make sure the node is in the cone and is no one of the leaves
    assert( Abc_NodeIsTravIdPrevious(pRoot) );
    Counter = Abc_NodeResubMffc_rec( pRoot );
    // move the labeled nodes to the end 
    Vec_PtrClear( p->vTemp );
    k = 0;
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vDecs, pObj, i, nLeaves )
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            Vec_PtrPush( p->vTemp, pObj );
        else
            Vec_PtrWriteEntry( vDecs, k++, pObj );
    // add the labeled nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vTemp, pObj, i )
        Vec_PtrWriteEntry( vDecs, k++, pObj );
    assert( k == Vec_PtrSize(p->vDecs) );
    assert( pRoot == Vec_PtrEntryLast(p->vDecs) );
    return Counter;
}